

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::PrintSymbolFlags
          (BinaryReaderObjdump *this,uint32_t flags)

{
  undefined *puVar1;
  uint uVar2;
  Enum EVar3;
  char *pcVar4;
  
  if (flags < 0x400) {
    puVar1 = (&PTR_anon_var_dwarf_240b3_00143390)[flags & 3];
    pcVar4 = "hidden";
    if ((flags & 4) == 0) {
      pcVar4 = "default";
    }
    PrintDetails(this," [");
    if ((flags & 0x10) == 0) {
      uVar2 = flags & 0x3f8;
    }
    else {
      PrintDetails(this," undefined");
      uVar2 = flags & 1000;
    }
    if ((uVar2 & 0x20) != 0) {
      PrintDetails(this," exported");
      uVar2 = uVar2 & 0xffffffd8;
    }
    if ((uVar2 & 0x40) != 0) {
      PrintDetails(this," explicit_name");
      uVar2 = uVar2 & 0xffffffbf;
    }
    if ((char)uVar2 < '\0') {
      PrintDetails(this," no_strip");
      uVar2 = uVar2 & 0x37f;
    }
    if ((uVar2 >> 8 & 1) != 0) {
      PrintDetails(this," tls");
      uVar2 = uVar2 & 0x2ff;
    }
    if (uVar2 >> 9 != 0) {
      PrintDetails(this," abs");
      uVar2 = uVar2 & 0x1ff;
    }
    if (uVar2 != 0) {
      PrintDetails(this," unknown_flags=%#x",(ulong)uVar2);
    }
    EVar3 = Ok;
    PrintDetails(this," binding=%s vis=%s ]\n",puVar1,pcVar4);
  }
  else {
    Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "Unknown symbols flags: %x\n",flags);
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderObjdump::PrintSymbolFlags(uint32_t flags) {
  if (flags > WABT_SYMBOL_FLAG_MAX) {
    err_stream_->Writef("Unknown symbols flags: %x\n", flags);
    return Result::Error;
  }

  const char* binding_name = nullptr;
  SymbolBinding binding =
      static_cast<SymbolBinding>(flags & WABT_SYMBOL_MASK_BINDING);
  switch (binding) {
    case SymbolBinding::Global:
      binding_name = "global";
      break;
    case SymbolBinding::Local:
      binding_name = "local";
      break;
    case SymbolBinding::Weak:
      binding_name = "weak";
      break;
  }
  flags &= ~WABT_SYMBOL_MASK_BINDING;

  const char* vis_name = nullptr;
  SymbolVisibility vis =
      static_cast<SymbolVisibility>(flags & WABT_SYMBOL_MASK_VISIBILITY);
  switch (vis) {
    case SymbolVisibility::Hidden:
      vis_name = "hidden";
      break;
    case SymbolVisibility::Default:
      vis_name = "default";
      break;
  }
  flags &= ~WABT_SYMBOL_MASK_VISIBILITY;

  PrintDetails(" [");
  if (flags & WABT_SYMBOL_FLAG_UNDEFINED) {
    PrintDetails(" undefined");
    flags &= ~WABT_SYMBOL_FLAG_UNDEFINED;
  }
  if (flags & WABT_SYMBOL_FLAG_EXPORTED) {
    PrintDetails(" exported");
    flags &= ~WABT_SYMBOL_FLAG_EXPORTED;
  }
  if (flags & WABT_SYMBOL_FLAG_EXPLICIT_NAME) {
    PrintDetails(" explicit_name");
    flags &= ~WABT_SYMBOL_FLAG_EXPLICIT_NAME;
  }
  if (flags & WABT_SYMBOL_FLAG_NO_STRIP) {
    PrintDetails(" no_strip");
    flags &= ~WABT_SYMBOL_FLAG_NO_STRIP;
  }
  if (flags & WABT_SYMBOL_FLAG_TLS) {
    PrintDetails(" tls");
    flags &= ~WABT_SYMBOL_FLAG_TLS;
  }
  if (flags & WABT_SYMBOL_FLAG_ABS) {
    PrintDetails(" abs");
    flags &= ~WABT_SYMBOL_FLAG_ABS;
  }
  if (flags != 0) {
    PrintDetails(" unknown_flags=%#x", flags);
  }
  PrintDetails(" binding=%s vis=%s ]\n", binding_name, vis_name);
  return Result::Ok;
}